

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_Vel3DFromAngle
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar4;
  AActor *this;
  bool bVar5;
  DAngle local_30;
  DAngle local_28;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_00434763;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this != (AActor *)0x0) {
        pPVar3 = (this->super_DThinker).super_DObject.Class;
        if (pPVar3 == (PClass *)0x0) {
          iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
          (this->super_DThinker).super_DObject.Class = pPVar3;
        }
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar5) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar5 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar5) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00434763;
        }
        goto LAB_004346e4;
      }
    }
    else if (this != (AActor *)0x0) goto LAB_00434753;
    this = (AActor *)0x0;
LAB_004346e4:
    if (numparam == 1) {
      pcVar4 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\x01') {
        if (numparam < 3) {
          pcVar4 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\x01') {
            if (numparam == 3) {
              pcVar4 = "(paramnum) < numparam";
            }
            else {
              if (param[3].field_0.field_3.Type == '\x01') {
                local_30.Degrees = (double)param[2].field_0.field_1.a;
                local_28.Degrees = (double)param[3].field_0.field_1.a;
                AActor::Vel3DFromAngle(this,&local_28,&local_30,param[1].field_0.f);
                return 0;
              }
              pcVar4 = "param[paramnum].Type == REGT_FLOAT";
            }
            __assert_fail(pcVar4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                          ,0x1dfb,
                          "int AF_AActor_Vel3DFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pcVar4 = "param[paramnum].Type == REGT_FLOAT";
        }
        __assert_fail(pcVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1dfa,
                      "int AF_AActor_Vel3DFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pcVar4 = "param[paramnum].Type == REGT_FLOAT";
    }
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1df9,
                  "int AF_AActor_Vel3DFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_00434753:
  pcVar4 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00434763:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1df8,
                "int AF_AActor_Vel3DFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Vel3DFromAngle)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(speed);
	PARAM_ANGLE(angle);
	PARAM_ANGLE(pitch);
	self->Vel3DFromAngle(pitch, angle, speed);
	return 0;
}